

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::UnaryFunctionLayerParams::MergePartialFromCodedStream
          (UnaryFunctionLayerParams *this,CodedInputStream *input)

{
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  bool local_89;
  UnaryFunctionLayerParams_Operation local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  UnaryFunctionLayerParams *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x100002b9 = input;
LAB_0027092b:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    if ((stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) &&
       (tag_2 = (uint32)*stack0xffffffffffffff98->buffer_,
       '\0' < (char)*stack0xffffffffffffff98->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback
                              (stack0xffffffffffffff98,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    local_74 = local_10;
    p.first = local_74;
    if ((uStack_c & 1) == 0) goto switchD_00270b42_default;
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((p.first & 0xff) == 8) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,&local_78);
        if (!bVar1) {
          return false;
        }
        set_type(this,local_78);
        goto LAB_0027092b;
      }
      break;
    case 2:
      if ((p.first & 0xff) != 0x15) break;
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (stack0xffffffffffffff98,&this->alpha_);
      goto joined_r0x00270c36;
    case 3:
      if ((p.first & 0xff) == 0x1d) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (stack0xffffffffffffff98,&this->epsilon_);
        goto joined_r0x00270c36;
      }
      break;
    case 4:
      if ((p.first & 0xff) == 0x25) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (stack0xffffffffffffff98,&this->shift_);
        goto joined_r0x00270c36;
      }
      break;
    case 5:
      if ((p.first & 0xff) == 0x2d) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (stack0xffffffffffffff98,&this->scale_);
        goto joined_r0x00270c36;
      }
    }
switchD_00270b42_default:
    if ((p.first == 0) ||
       (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
       WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    bVar1 = google::protobuf::internal::WireFormatLite::SkipField(stack0xffffffffffffff98,p.first);
joined_r0x00270c36:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool UnaryFunctionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.UnaryFunctionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.UnaryFunctionLayerParams.Operation type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_type(static_cast< ::CoreML::Specification::UnaryFunctionLayerParams_Operation >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float alpha = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &alpha_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float epsilon = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &epsilon_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float shift = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &shift_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float scale = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.UnaryFunctionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.UnaryFunctionLayerParams)
  return false;
#undef DO_
}